

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O3

void dirABYTE(void)

{
  int iVar1;
  undefined8 in_RAX;
  aint add;
  int local_4;
  
  local_4 = (int)((ulong)in_RAX >> 0x20);
  iVar1 = ParseExpressionNoSyntaxError(&lp,&local_4);
  if (iVar1 == 0) {
    Error("ABYTE <offset> <bytes>: parsing <offset> failed",bp,SUPPRESS);
  }
  else {
    Relocation::checkAndWarn(false);
    getBytesWithCheck(local_4,0,false);
  }
  return;
}

Assistant:

static void dirABYTE() {
	aint add;
	if (ParseExpressionNoSyntaxError(lp, add)) {
		Relocation::checkAndWarn();
		getBytesWithCheck(add);
	} else {
		Error("ABYTE <offset> <bytes>: parsing <offset> failed", bp, SUPPRESS);
	}
}